

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void enet_host_channel_limit(ENetHost *host,size_t channelLimit)

{
  size_t channelLimit_local;
  ENetHost *host_local;
  
  if ((channelLimit == 0) || (0xff < channelLimit)) {
    channelLimit_local = 0xff;
  }
  else {
    channelLimit_local = channelLimit;
    if (channelLimit == 0) {
      channelLimit_local = 1;
    }
  }
  host->channelLimit = channelLimit_local;
  return;
}

Assistant:

void
enet_host_channel_limit (ENetHost * host, size_t channelLimit)
{
    if (! channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
    else
    if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

    host -> channelLimit = channelLimit;
}